

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O0

double get_ieee754_double(uint8_t *p)

{
  uint8_t *q;
  double d;
  uint8_t *p_local;
  
  q._7_1_ = *p;
  q._6_1_ = p[1];
  q._5_1_ = p[2];
  q._4_1_ = p[3];
  q._3_1_ = p[4];
  q._2_1_ = p[5];
  q._1_1_ = p[6];
  q._0_1_ = p[7];
  return (double)q;
}

Assistant:

static double get_ieee754_double(const uint8_t *restrict p) {
    volatile double d;
    volatile uint8_t *q = (volatile void *)&d;
#if MMDB_LITTLE_ENDIAN || _WIN32
    q[7] = p[0];
    q[6] = p[1];
    q[5] = p[2];
    q[4] = p[3];
    q[3] = p[4];
    q[2] = p[5];
    q[1] = p[6];
    q[0] = p[7];
#else
    memcpy(q, p, 8);
#endif

    return d;
}